

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclibprs.cpp
# Opt level: O3

void __thiscall CTcLibParser::parse_lib(CTcLibParser *this)

{
  CTcSrcFile *pCVar1;
  CTcSrcFile *pCVar2;
  int iVar3;
  uint uVar4;
  CTcSrcFile *pCVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  char cVar10;
  long lVar11;
  char buf2 [128];
  char buf [1024];
  char expbuf [1024];
  undefined8 local_8c0;
  undefined1 local_8b8 [126];
  char acStack_83a [1025];
  char local_439;
  char local_438 [1024];
  undefined1 auStack_38 [8];
  
  pCVar5 = CTcSrcFile::open_ascii(this->lib_name_);
  if (pCVar5 == (CTcSrcFile *)0x0) {
    (*this->_vptr_CTcLibParser[2])(this);
    this->err_cnt_ = this->err_cnt_ + 1;
  }
  else {
    iVar3 = (*(pCVar5->super_CTcSrcObject)._vptr_CTcSrcObject[2])(pCVar5,acStack_83a + 2,0x400);
    lVar11 = CONCAT44(extraout_var,iVar3);
    pCVar2 = pCVar5;
    pCVar1 = local_8c0;
    while (local_8c0 = pCVar2, lVar11 != 0) {
      pcVar8 = local_438;
      this->linenum_ = this->linenum_ + 1;
      do {
        lVar7 = lVar11 + -1;
        if (lVar7 == 0) {
          lVar7 = 0;
          break;
        }
        pcVar6 = acStack_83a + lVar11;
        lVar11 = lVar7;
      } while ((*pcVar6 == '\r') || (*pcVar6 == '\n'));
      if (acStack_83a[lVar7 + 2] == '\0') {
        iVar3 = (*(pCVar5->super_CTcSrcObject)._vptr_CTcSrcObject[2])(pCVar5,local_8b8,0x80);
        lVar11 = CONCAT44(extraout_var_00,iVar3);
        if (lVar11 == 0) goto LAB_001f5512;
        (*this->_vptr_CTcLibParser[3])(this);
        this->err_cnt_ = this->err_cnt_ + 1;
        do {
          if ((lVar11 != 1) &&
             ((cVar10 = local_8b8[lVar11 + -2], cVar10 == '\n' || (cVar10 == '\r')))) break;
          iVar3 = (*(pCVar5->super_CTcSrcObject)._vptr_CTcSrcObject[2])(pCVar5,local_8b8,0x80);
          lVar11 = CONCAT44(extraout_var_01,iVar3);
        } while (lVar11 != 0);
      }
      else {
LAB_001f5512:
        acStack_83a[lVar7 + 2] = '\0';
        pcVar6 = acStack_83a + 2;
        while( true ) {
          if (*pcVar6 == '$') {
            if (pcVar6[1] == '$') {
              pcVar6 = pcVar6 + 1;
            }
            else {
              if (pcVar6[1] == '(') {
                pcVar9 = pcVar6 + 2;
                for (lVar11 = 0; pcVar9[lVar11] != '\0'; lVar11 = lVar11 + 1) {
                  if (pcVar9[lVar11] == ')') {
                    uVar4 = (*this->_vptr_CTcLibParser[0x15])
                                      (this,pcVar8,auStack_38 + -(long)pcVar8,pcVar9,lVar11);
                    pcVar6 = pcVar9 + lVar11;
                    if ((int)uVar4 < 0) {
                      (*this->_vptr_CTcLibParser[7])(this,pcVar9,lVar11);
                    }
                    else {
                      if (auStack_38 + -(long)pcVar8 < (undefined1 *)(ulong)uVar4)
                      goto LAB_001f55e9;
                      pcVar8 = pcVar8 + (long)(ulong)uVar4;
                    }
                    goto LAB_001f558d;
                  }
                }
              }
              (*this->_vptr_CTcLibParser[8])(this);
            }
          }
          else if (*pcVar6 == '\0') goto LAB_001f55f2;
          if (pcVar8 + (-0x3ff - (long)local_438) < (char *)0xfffffffffffffbff) break;
          *pcVar8 = *pcVar6;
          pcVar8 = pcVar8 + 1;
LAB_001f558d:
          pcVar6 = pcVar6 + 1;
        }
LAB_001f55e9:
        (*this->_vptr_CTcLibParser[4])(this);
LAB_001f55f2:
        *pcVar8 = '\0';
        pcVar8 = &local_439;
        do {
          pcVar6 = pcVar8;
          pcVar8 = pcVar6 + 1;
          cVar10 = pcVar6[1];
          iVar3 = isspace((int)cVar10);
        } while (iVar3 != 0);
        if ((cVar10 != '\0') && (pcVar9 = pcVar8, cVar10 != '#')) {
          while ((cVar10 != '\0' && ((cVar10 != ':' && (iVar3 = isspace((int)cVar10), iVar3 == 0))))
                ) {
            cVar10 = pcVar9[1];
            pcVar6 = pcVar6 + 1;
            pcVar9 = pcVar9 + 1;
          }
          do {
            cVar10 = pcVar6[1];
            pcVar6 = pcVar6 + 1;
            iVar3 = isspace((int)cVar10);
          } while (iVar3 != 0);
          if (cVar10 == ':') {
            *pcVar9 = '\0';
            do {
              pcVar9 = pcVar6 + 1;
              pcVar6 = pcVar6 + 1;
              iVar3 = isspace((int)*pcVar9);
            } while (iVar3 != 0);
            (*this->_vptr_CTcLibParser[0xb])(this,pcVar8,pcVar6);
          }
          else {
            iVar3 = stricmp(pcVar8,"nodef");
            if (iVar3 == 0) {
              (*this->_vptr_CTcLibParser[0x16])(this);
            }
            else {
              (*this->_vptr_CTcLibParser[5])();
              this->err_cnt_ = this->err_cnt_ + 1;
            }
          }
        }
      }
      pCVar5 = local_8c0;
      iVar3 = (*(local_8c0->super_CTcSrcObject)._vptr_CTcSrcObject[2])
                        (local_8c0,acStack_83a + 2,0x400);
      pCVar2 = local_8c0;
      pCVar1 = local_8c0;
      lVar11 = CONCAT44(extraout_var_02,iVar3);
    }
    local_8c0 = pCVar1;
    (*(pCVar5->super_CTcSrcObject)._vptr_CTcSrcObject[1])(pCVar5);
  }
  return;
}

Assistant:

void CTcLibParser::parse_lib()
{
    CTcSrcFile *fp;

    /* open our file - we only accept plain ASCII here */
    fp = CTcSrcFile::open_ascii(lib_name_);

    /* if that failed, abort */
    if (fp == 0)
    {
        err_open_file();
        ++err_cnt_;
        return;
    }

    /* keep going until we run out of file */
    for (;;)
    {
        char buf[1024];
        char expbuf[1024];
        size_t len;
        char *p;
        char *dst;
        char *sep;
        char *var_name;
        char *var_val;

        /* read the next line of text */
        if ((len = fp->read_line(buf, sizeof(buf))) == 0)
            break;

        /* count the line */
        ++linenum_;

        /* un-count the terminating null byte in the length */
        --len;

        /* check for a terminating newline sequence */
        while (len != 0 && (buf[len-1] == '\n' || buf[len-1] == '\r'))
            --len;

        /* if we didn't find a newline, the line is too long */
        if (buf[len] == '\0')
        {
            char buf2[128];
            size_t len2;
            
            /* 
             *   If we can read anything more from the file, this indicates
             *   that the line was simply too long to read into our buffer;
             *   skip the rest of the line and log an error in this case.
             *   If we can't read any more text, it means we've reached the
             *   end of the file. 
             */
            if ((len2 = fp->read_line(buf2, sizeof(buf2))) != 0)
            {
                /* there's more, so the line is too long - flag an error */
                err_line_too_long();
                ++err_cnt_;

                /* skip text until we find a newline */
                for (;;)
                {
                    /* un-count the null terminator */
                    --len2;

                    /* if we've found our newline, we're done skipping */
                    if (len2 != 0
                        && (buf2[len2-1] == '\n' || buf2[len2-1] == '\r'))
                        break;
                    
                    /* read another chunk */
                    if ((len2 = fp->read_line(buf2, sizeof(buf2))) == 0)
                        break;
                }

                /* we've skipped the line, so go back for the next */
                continue;
            }
        }

        /* remove the newline from the buffer */
        buf[len] = '\0';

        /* scan for and expand preprocessor symbols */
        for (p = buf, dst = expbuf ; *p != '\0' ; ++p)
        {
            /* check for the start of a preprocessor symbol */
            if (*p == '$')
            {
                /* 
                 *   We have a dollar sign, so this *could* be a preprocessor
                 *   symbol.  If the next character is '(', then find the
                 *   matching ')', and take the part between the parentheses
                 *   as a symbol to expand.  If the next character is '$',
                 *   replace the pair with a single dollar sign.  If the next
                 *   character is anything else, the '$' is not significant,
                 *   so leave it as it is.  
                 */
                if (*(p+1) == '(')
                {
                    char *closep;

                    /* find the close paren */
                    for (closep = p + 2 ; *closep != '\0' && *closep != ')' ;
                         ++closep) ;

                    /* 
                     *   if we found the close paren, process it; if not,
                     *   just ignore the whole thing and treat the '$(' as a
                     *   pair of ordinary characters 
                     */
                    if (*closep == ')')
                    {
                        int vallen;
                        size_t symlen;
                        size_t rem;

                        /* skip to the start of the symbol name */
                        p += 2;

                        /* get the length of the symbol */
                        symlen = closep - p;

                        /* figure out how much space we have left */
                        rem = sizeof(expbuf) - (dst - expbuf);

                        /* look up the symbol's value */
                        vallen = get_pp_symbol(dst, rem, p, symlen);

                        /* note overflow or undefined symbol errors */
                        if (vallen < 0)
                        {
                            /* it's undefined - note it */
                            err_undef_sym(p, symlen);
                        }
                        else if ((size_t)vallen > rem)
                        {
                            /* it's too long - note it and give up now */
                            err_expanded_line_too_long();
                            break;
                        }
                        else
                        {
                            /* success - advance past the value */
                            dst += vallen;
                        }

                        /* 
                         *   Skip to the close paren and continue with the
                         *   main loop.  We don't need to copy any input for
                         *   the symbol, because we've already copied the
                         *   expansion instead; so just go back to the start
                         *   of the input loop.  
                         */
                        p = closep;
                        continue;
                    }
                    else
                    {
                        /* ill-formed macro substitution expression */
                        err_invalid_dollar();
                    }
                }
                else if (*(p+1) == '$')
                {
                    /* 
                     *   we have a double dollar sign, so turn it into a
                     *   single dollar sign - simply skip the first of the
                     *   pair so we only keep one 
                     */
                    ++p;
                }
                else
                {
                    /* invalid '$' sequence - warn about it */
                    err_invalid_dollar();
                }
            }

            /* make sure we have room for this character plus a null byte */
            if ((dst - expbuf) + 2 > sizeof(expbuf))
            {
                err_expanded_line_too_long();
                break;
            }

            /* copy this character to the destination string */
            *dst++ = *p;
        }

        /* null-terminate the expanded buffer */
        *dst = '\0';

        /* skip leading spaces */
        for (p = expbuf ; isspace(*p) ; ++p) ;

        /* if the line is empty or starts with '#', skip it */
        if (*p == '\0' || *p == '#')
            continue;

        /* the variable name starts here */
        var_name = p;

        /* the variable name ends at the next space or colon */
        for ( ; *p != '\0' && *p != ':' && !isspace(*p) ; ++p) ;

        /* note where the variable name ends */
        sep = p;

        /* skip spaces after the end of the variable name */
        for ( ; isspace(*p) ; ++p) ;

        /* 
         *   if we didn't find a colon after the variable name, it's an
         *   error; flag the error and skip the line 
         */
        if (*p != ':')
        {
            /* check for stand-alone flags */
            if (stricmp(var_name, "nodef") == 0)
            {
                /* scan the "nodef" flag */
                scan_nodef();
            }
            else
            {
                /* 
                 *   it's not a valid stand-alone flag; the definition must
                 *   be missing the value portion 
                 */
                err_missing_colon();
                ++err_cnt_;
            }

            /* we're done with this line now */
            continue;
        }

        /* put a null terminator at the end of the variable name */
        *sep = '\0';

        /* skip any spaces after the colon */
        for (++p ; isspace(*p) ; ++p) ;

        /* the value starts here */
        var_val = p;

        /* scan the value */
        scan_var(var_name, var_val);
    }

    /* we're done - close the file */
    delete fp;
}